

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

bool __thiscall
CheckDatasetsExistence::operator()
          (CheckDatasetsExistence *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataset,bool print_message)

{
  path *lhs;
  OutputBox *this_00;
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000011;
  pointer p_00;
  path p;
  allocator local_bd;
  uint local_bc;
  pointer local_b8;
  path local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = (dataset->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_bc = (uint)CONCAT71(in_register_00000011,print_message) ^ 1;
  bVar2 = false;
  for (p_00 = (dataset->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; p_00 != local_b8; p_00 = p_00 + 1) {
    lhs = this->input_path_;
    filesystem::path::path((path *)&local_70,p_00);
    filesystem::operator/((path *)&local_50,lhs,(path *)&local_70);
    filesystem::path::path((path *)&local_90,this->input_txt_);
    filesystem::operator/(&local_b0,(path *)&local_50,(path *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = filesystem::exists(&local_b0,this->ec_);
    if (bVar1 || (char)local_bc != '\0') {
      bVar2 = (bool)(bVar2 | bVar1);
    }
    else {
      this_00 = this->ob_;
      std::operator+(&local_70,"There is no dataset \'",p_00);
      std::operator+(&local_50,&local_70,"\' (no files.txt available), skipped");
      std::__cxx11::string::string((string *)&local_90,"",&local_bd);
      OutputBox::Cwarning(this_00,&local_50,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return bVar2;
}

Assistant:

bool operator()(const std::vector<cv::String>& dataset, bool print_message) {
        // Check if all the datasets' files.txt exist
        bool exists_one_dataset = false;
        for (auto& x : dataset) {
            path p = input_path_ / path(x) / path(input_txt_);
            if (!exists(p, ec_)) {
                if (print_message) {
                    ob_.Cwarning("There is no dataset '" + x + "' (no files.txt available), skipped");
                }
            }
            else {
                exists_one_dataset = true;
            }
        }
        return exists_one_dataset;
    }